

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

cio_error bs_write_ok(cio_buffered_stream *buffered_stream,cio_write_buffer *buf,
                     cio_buffered_stream_write_handler_t handler,void *handler_context)

{
  ulong uVar1;
  size_t sVar2;
  uint i;
  ulong uVar3;
  
  uVar1 = (buf->data).head.q_len;
  for (uVar3 = 0; sVar2 = write_buffer_pos, uVar3 < uVar1; uVar3 = (ulong)((int)uVar3 + 1)) {
    buf = buf->next;
    memcpy(write_buffer + write_buffer_pos,(buf->data).element.field_0.const_data,
           (buf->data).element.length);
    write_buffer_pos = sVar2 + (buf->data).element.length;
  }
  (*handler)(buffered_stream,handler_context,CIO_SUCCESS);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error bs_write_ok(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buf, cio_buffered_stream_write_handler_t handler, void *handler_context)
{
	size_t len = cio_write_buffer_get_num_buffer_elements(buf);
	for (unsigned int i = 0; i < len; i++) {
		buf = buf->next;
		memcpy(&write_buffer[write_buffer_pos], buf->data.element.data, buf->data.element.length);
		write_buffer_pos += buf->data.element.length;
	}

	handler(buffered_stream, handler_context, CIO_SUCCESS);
	return CIO_SUCCESS;
}